

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
TypeTest_CanonicalizeTypesBeforeSubtyping_Test::TestBody
          (TypeTest_CanonicalizeTypesBeforeSubtyping_Test *this)

{
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  bool bVar1;
  Entry *pEVar2;
  char *message;
  char *in_R9;
  Entry EVar3;
  optional<wasm::HeapType> other;
  optional<wasm::HeapType> other_00;
  optional<wasm::HeapType> other_01;
  string local_2e8;
  AssertHelper local_2c8;
  Message local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  undefined1 local_278 [12];
  Entry local_268;
  Entry local_258;
  allocator<wasm::Field> local_241;
  Entry local_240;
  uintptr_t local_230;
  uintptr_t local_228;
  Field local_220;
  iterator local_210;
  size_type local_208;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_200;
  Struct local_1e8;
  Entry local_1d0;
  allocator<wasm::Field> local_1b9;
  Entry local_1b8;
  uintptr_t local_1a8;
  uintptr_t local_1a0;
  Field local_198;
  iterator local_188;
  size_type local_180;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_178;
  Struct local_160;
  Entry local_148;
  undefined1 local_138 [12];
  Entry local_128;
  Entry local_118;
  Struct local_108;
  Entry local_e8;
  Struct local_d8;
  Entry local_b8;
  undefined1 local_a8 [12];
  Entry local_98;
  Entry local_88;
  Struct local_78;
  Entry local_58;
  Struct local_48 [2];
  TypeBuilder local_18;
  TypeBuilder builder;
  TypeTest_CanonicalizeTypesBeforeSubtyping_Test *this_local;
  
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)this;
  ::wasm::TypeBuilder::TypeBuilder(&local_18,6);
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_18,0);
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(local_48);
  local_58 = ::wasm::TypeBuilder::operator[](&local_18,0);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_58,true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,local_48);
  ::wasm::Struct::~Struct(local_48);
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_78);
  local_88 = ::wasm::TypeBuilder::operator[](&local_18,1);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_88,true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,&local_78);
  ::wasm::Struct::~Struct(&local_78);
  local_98 = ::wasm::TypeBuilder::operator[](&local_18,1);
  local_b8 = ::wasm::TypeBuilder::operator[](&local_18,0);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_a8,&local_b8);
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_a8._0_8_;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_a8[8];
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_a8._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_98,other);
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_18,2);
  local_d8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_d8);
  local_e8 = ::wasm::TypeBuilder::operator[](&local_18,2);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_e8,true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,&local_d8);
  ::wasm::Struct::~Struct(&local_d8);
  local_108.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_108);
  local_118 = ::wasm::TypeBuilder::operator[](&local_18,3);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_118,true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,&local_108);
  ::wasm::Struct::~Struct(&local_108);
  local_128 = ::wasm::TypeBuilder::operator[](&local_18,3);
  local_148 = ::wasm::TypeBuilder::operator[](&local_18,2);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_138,&local_148);
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_138._0_8_;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_138[8];
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_138._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_128,other_00);
  local_1b8 = ::wasm::TypeBuilder::operator[](&local_18,0);
  local_1a8 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_1b8);
  local_1a0 = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_18,(Nullability)local_1a8,Exact);
  ::wasm::Field::Field(&local_198,(Type)local_1a0,Immutable);
  local_188 = &local_198;
  local_180 = 1;
  std::allocator<wasm::Field>::allocator(&local_1b9);
  __l_00._M_len = local_180;
  __l_00._M_array = local_188;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_178,__l_00,&local_1b9);
  ::wasm::Struct::Struct(&local_160,&local_178);
  local_1d0 = ::wasm::TypeBuilder::operator[](&local_18,4);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_1d0,true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,&local_160);
  ::wasm::Struct::~Struct(&local_160);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_178);
  std::allocator<wasm::Field>::~allocator(&local_1b9);
  local_240 = ::wasm::TypeBuilder::operator[](&local_18,3);
  local_230 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_240);
  local_228 = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_18,(Nullability)local_230,Exact);
  ::wasm::Field::Field(&local_220,(Type)local_228,Immutable);
  local_210 = &local_220;
  local_208 = 1;
  std::allocator<wasm::Field>::allocator(&local_241);
  __l._M_len = local_208;
  __l._M_array = local_210;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_200,__l,&local_241);
  ::wasm::Struct::Struct(&local_1e8,&local_200);
  local_258 = ::wasm::TypeBuilder::operator[](&local_18,5);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_258,true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,&local_1e8);
  ::wasm::Struct::~Struct(&local_1e8);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_200);
  std::allocator<wasm::Field>::~allocator(&local_241);
  local_268 = ::wasm::TypeBuilder::operator[](&local_18,5);
  EVar3 = ::wasm::TypeBuilder::operator[](&local_18,4);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar3.builder;
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_278,
             (Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18));
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_278._0_8_;
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_278[8];
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_278._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_268,other_01);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_2b8,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e8,(internal *)local_2b8,(AssertionResult *)0x4945b1,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x28d,message);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_18);
  return;
}

Assistant:

TEST_F(TypeTest, CanonicalizeTypesBeforeSubtyping) {
  TypeBuilder builder(6);
  // A rec group
  builder.createRecGroup(0, 2);
  builder[0].setOpen() = Struct{};
  builder[1].setOpen() = Struct{};
  builder[1].subTypeOf(builder[0]);

  // The same rec group again
  builder.createRecGroup(2, 2);
  builder[2].setOpen() = Struct{};
  builder[3].setOpen() = Struct{};
  builder[3].subTypeOf(builder[2]);

  // This subtyping only validates if the previous two groups are deduplicated
  // before checking subtype validity.
  builder[4].setOpen() =
    Struct({Field(builder.getTempRefType(builder[0], Nullable), Immutable)});
  builder[5].setOpen() =
    Struct({Field(builder.getTempRefType(builder[3], Nullable), Immutable)});
  builder[5].subTypeOf(builder[4]);

  auto result = builder.build();
  EXPECT_TRUE(result);
}